

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int canBiomeGenerate(int layerId,int mc,uint32_t flags,int id)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  
  if (0xf < mc) {
    if (layerId == 0x30) {
      iVar3 = isShallowOcean(id);
      return iVar3;
    }
    if (((flags & 4) != 0) && (iVar3 = isOceanic(id), iVar3 != 0)) {
      return (uint)(id != 0x2f);
    }
  }
  if (layerId == 0x15 && 0x3f < id) {
    return 0;
  }
  if ((layerId == 0x15) || (0x10 < mc && layerId == 0x16)) {
    if (((uint)id < 0x26) && ((0x2400800000U >> ((ulong)(uint)id & 0x3f) & 1) != 0)) {
      return 0;
    }
LAB_001156ca:
    if (0x3f < id && id != 0xa8) {
      return 0;
    }
    bVar2 = 1;
    if ((id - 0xdU < 0x18) && ((0x948275U >> (id - 0xdU & 0x1f) & 1) != 0)) {
      return 0;
    }
  }
  else {
    if (9 < mc && layerId == 0x19) goto LAB_001156ca;
    bVar2 = 0;
    if ((mc < 4 && layerId == 0x18) && (bVar2 = 1, id == 0xf)) {
      return 0;
    }
  }
  bVar1 = (bool)(layerId == 0x1d | bVar2);
  if ((bool)(id == 10 & bVar1)) {
    return 0;
  }
  if ((bVar1) || (mc < 10 && layerId == 0x21)) {
    bVar2 = 1;
    if (0x1a < (uint)id) goto LAB_00115797;
    if ((0x6110000U >> (id & 0x1fU) & 1) != 0) {
      return 0;
    }
    if (id != 0xf) goto LAB_00115797;
    if (mc != 3) {
      return 0;
    }
  }
  else {
    bVar2 = 0;
    if (((9 < mc && layerId == 0x1e) && (bVar2 = 1, (uint)id < 0x1b)) &&
       ((0x6018000U >> (id & 0x1fU) & 1) != 0)) {
      return 0;
    }
LAB_00115797:
    bVar1 = (bool)(layerId == 0x22 | bVar2);
    if ((bool)(id == 7 & bVar1)) {
      return 0;
    }
    if ((bVar1) || (mc < 10 && layerId == 0x23)) {
      if (id == 0xb) {
        return 0;
      }
    }
    else if (layerId != 0x2f) {
      if ((layerId != 0x38) && (layerId != 0x37 || mc < 0x10)) {
        printf("canBiomeGenerate(): unsupported layer (%d) or version (%d)\n",layerId,mc);
        return 0;
      }
      goto LAB_00115844;
    }
  }
  iVar3 = isDeepOcean(id);
  if ((id != 0x18) && (iVar3 != 0)) {
    return 0;
  }
  iVar3 = isShallowOcean(id);
  if ((id != 0) && ((iVar3 != 0 && (id != 10 || 9 < mc)))) {
    return 0;
  }
LAB_00115844:
  iVar3 = isOverworld(mc,id);
  return iVar3;
}

Assistant:

int canBiomeGenerate(int layerId, int mc, uint32_t flags, int id)
{
    int dofilter = 0;

    if (mc >= MC_1_13)
    {
        if (layerId == L_OCEAN_TEMP_256)
            return isShallowOcean(id);
        if ((flags & FORCE_OCEAN_VARIANTS) && isOceanic(id))
            return id != deep_warm_ocean;
    }

    if (dofilter || layerId == L_BIOME_256)
    {
        dofilter = 1;
        if (id >= 64)
            return 0;
    }
    if (dofilter || (layerId == L_BAMBOO_256 && mc >= MC_1_14))
    {
        dofilter = 1;
        switch (id)
        {
        case jungle_edge:
        case wooded_mountains:
        case badlands:
            return 0;
        }
    }
    if (dofilter || (layerId == L_BIOME_EDGE_64 && mc >= MC_1_7))
    {
        dofilter = 1;
        if (id >= 64 && id != bamboo_jungle)
            return 0;
        switch (id)
        {
        case snowy_mountains:
        case desert_hills:
        case wooded_hills:
        case taiga_hills:
        case jungle_hills:
        case birch_forest_hills:
        case snowy_taiga_hills:
        case giant_tree_taiga_hills:
        case savanna_plateau:
            return 0;
        }
    }
    if (dofilter || (layerId == L_ZOOM_64 && mc <= MC_1_0))
    {
        dofilter = 1;
        if (id == mushroom_field_shore)
            return 0;
    }
    if (dofilter || layerId == L_HILLS_64)
    {
        dofilter = 1;
        if (id == frozen_ocean)
            return 0;
        // sunflower_plains actually generates at Hills layer as well
    }
    if (dofilter || (layerId == L_ZOOM_16 && mc <= MC_1_6))
    {
        dofilter = 1;
        if (id == mountain_edge)
            return 0;
    }
    if (dofilter || (layerId == L_SUNFLOWER_64 && mc >= MC_1_7))
    {
        dofilter = 1;
        switch (id)
        {
        case beach:
        case stone_shore:
        case snowy_beach:
            return 0;
        case mushroom_field_shore:
            if (mc != MC_1_0)
                return 0;
            break;
        }
    }
    if (dofilter || layerId == L_SHORE_16)
    {
        dofilter = 1;
        if (id == river)
            return 0;
    }
    if (dofilter || (layerId == L_SWAMP_RIVER_16 && mc <= MC_1_6))
    {
        dofilter = 1;
        if (id == frozen_river)
            return 0;
    }
    if (dofilter || layerId == L_RIVER_MIX_4)
    {
        dofilter = 1;
        if (isDeepOcean(id) && id != deep_ocean)
            return 0;
        if (isShallowOcean(id) && id != ocean)
        {
            if (mc >= MC_1_7 || id != frozen_ocean)
                return 0;
        }
    }
    if (dofilter || (layerId == L_OCEAN_MIX_4 && mc >= MC_1_13))
    {
        dofilter = 1;
    }

    if (!dofilter && layerId != L_VORONOI_1)
    {
        printf("canBiomeGenerate(): unsupported layer (%d) or version (%d)\n",
            layerId, mc);
        return 0;
    }
    return isOverworld(mc, id);
}